

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int printhelp(char *msg)

{
  int iVar1;
  
  if (msg != (char *)0x0) {
    printf("%s\n\n\n",msg);
  }
  puts("Usage: glslopt <-f|-v> <input shader> [<output shader>]");
  puts("\t-f : fragment shader (default)");
  puts("\t-v : vertex shader");
  puts("\t-1 : target OpenGL (default)");
  puts("\t-2 : target OpenGL ES 2.0");
  puts("\t-3 : target OpenGL ES 3.0");
  iVar1 = puts("\n\tIf no output specified, output is to [input].out.");
  return iVar1;
}

Assistant:

static int printhelp(const char* msg)
{
	if (msg) printf("%s\n\n\n", msg);
	printf("Usage: glslopt <-f|-v> <input shader> [<output shader>]\n");
	printf("\t-f : fragment shader (default)\n");
	printf("\t-v : vertex shader\n");
	printf("\t-1 : target OpenGL (default)\n");
	printf("\t-2 : target OpenGL ES 2.0\n");
	printf("\t-3 : target OpenGL ES 3.0\n");
	printf("\n\tIf no output specified, output is to [input].out.\n");
	return 1;
}